

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

stb_uint64 stb_fget_varlen64(FILE *f)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  undefined8 local_28;
  ulong uStack_18;
  uchar d;
  stb_uint64 z;
  FILE *f_local;
  
  uVar2 = fgetc((FILE *)f);
  bVar1 = (byte)uVar2;
  if (bVar1 < 0x80) {
    uStack_18 = (ulong)bVar1;
  }
  else {
    if (bVar1 < 0xc0) {
      uStack_18 = (ulong)(((uVar2 & 0xff) - 0x80) * 0x100);
    }
    else {
      if (bVar1 < 0xe0) {
        uStack_18 = (ulong)(((uVar2 & 0xff) - 0xc0) * 0x10000);
      }
      else {
        if (bVar1 < 0xf0) {
          uStack_18 = (ulong)(((uVar2 & 0xff) - 0xe0) * 0x1000000);
        }
        else {
          if (bVar1 < 0xf8) {
            uStack_18 = (long)(int)((uVar2 & 0xff) - 0xf0) << 0x20;
          }
          else {
            if (bVar1 < 0xfc) {
              uStack_18 = (long)(int)((uVar2 & 0xff) - 0xf8) << 0x28;
            }
            else {
              if (bVar1 < 0xfe) {
                uStack_18 = (long)(int)((uVar2 & 0xff) - 0xfc) << 0x30;
              }
              else {
                if (bVar1 == 0xff) {
                  uVar2 = fgetc((FILE *)f);
                  uStack_18 = (ulong)(uVar2 & 0xff);
                }
                else {
                  uStack_18 = (ulong)(int)((uVar2 & 0xff) - 0xfe);
                }
                uStack_18 = uStack_18 << 0x38;
                uVar2 = fgetc((FILE *)f);
                uStack_18 = (ulong)(uVar2 & 0xff) << 0x30 | uStack_18;
              }
              uVar2 = fgetc((FILE *)f);
              uStack_18 = (ulong)(uVar2 & 0xff) << 0x28 | uStack_18;
            }
            uVar2 = fgetc((FILE *)f);
            uStack_18 = (ulong)(uVar2 & 0xff) << 0x20 | uStack_18;
          }
          iVar3 = fgetc((FILE *)f);
          uStack_18 = (uint)(iVar3 << 0x18) | uStack_18;
        }
        uVar2 = fgetc((FILE *)f);
        uStack_18 = (uVar2 & 0xff) << 0x10 | uStack_18;
      }
      uVar2 = fgetc((FILE *)f);
      uStack_18 = (uVar2 & 0xff) << 8 | uStack_18;
    }
    uVar2 = fgetc((FILE *)f);
    uStack_18 = uVar2 & 0xff | uStack_18;
  }
  if ((uStack_18 & 1) == 0) {
    local_28 = uStack_18 >> 1;
  }
  else {
    local_28 = uStack_18 >> 1 ^ 0xffffffffffffffff;
  }
  return local_28;
}

Assistant:

stb_uint64   stb_fget_varlen64(FILE *f)
{
   stb_uint64 z;
   unsigned char d;
   d = stb_fgetc(f);

   if (d >= 0x80) {
      if (d >= 0xc0) {
         if (d >= 0xe0) {
            if (d >= 0xf0) {
               if (d >= 0xf8) {
                  if (d >= 0xfc) {
                     if (d >= 0xfe) {
                        if (d >= 0xff)
                           z = (stb_uint64) stb_fgetc(f) << 56;
                        else
                           z = (stb_uint64) (d - 0xfe) << 56;
                        z |= (stb_uint64) stb_fgetc(f) << 48;
                     } else z = (stb_uint64) (d - 0xfc) << 48;
                     z |= (stb_uint64) stb_fgetc(f) << 40;
                  } else z = (stb_uint64) (d - 0xf8) << 40;
                  z |= (stb_uint64) stb_fgetc(f) << 32;
               } else z = (stb_uint64) (d - 0xf0) << 32;
               z |= (stb_uint) stb_fgetc(f) << 24;
            } else z = (stb_uint) (d - 0xe0) << 24;
            z |= (stb_uint) stb_fgetc(f) << 16;
         } else z = (stb_uint) (d - 0xc0) << 16;
         z |= (stb_uint) stb_fgetc(f) << 8;
      } else z = (stb_uint) (d - 0x80) << 8;
      z |= stb_fgetc(f);
   } else
      z = d;

   return (z & 1) ? ~(z >> 1) : (z >> 1);
}